

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrdemo_tools.cxx
# Opt level: O0

void __thiscall xrdemo_tools::process(xrdemo_tools *this,cl_parser *cl)

{
  bool bVar1;
  size_t sVar2;
  char *path;
  undefined8 uVar3;
  undefined1 local_d0 [8];
  xr_obj_motion omotion;
  undefined1 local_50 [8];
  string target;
  char *source;
  size_t num_params;
  size_t i;
  cl_parser *cl_local;
  xrdemo_tools *this_local;
  
  bVar1 = batch_helper::prepare_target_name(&this->super_batch_helper,cl);
  if (bVar1) {
    num_params = 0;
    sVar2 = cl_parser::num_params(cl);
    for (; num_params != sVar2; num_params = num_params + 1) {
      target.field_2._8_8_ = cl_parser::param(cl,num_params);
      std::__cxx11::string::string((string *)local_50);
      batch_helper::make_target_name
                (&this->super_batch_helper,(string *)local_50,(char *)target.field_2._8_8_,".anm");
      xray_re::xr_obj_motion::xr_obj_motion((xr_obj_motion *)local_d0);
      bVar1 = load_xrdemo((xr_obj_motion *)local_d0,(char *)target.field_2._8_8_);
      if (bVar1) {
        path = (char *)std::__cxx11::string::c_str();
        bVar1 = xray_re::xr_obj_motion::save_anm((xr_obj_motion *)local_d0,path);
        if (!bVar1) {
          uVar3 = std::__cxx11::string::c_str();
          xray_re::msg("can\'t save %s",uVar3);
        }
      }
      else {
        xray_re::msg("can\'t load %s",target.field_2._8_8_);
      }
      xray_re::xr_obj_motion::~xr_obj_motion((xr_obj_motion *)local_d0);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void xrdemo_tools::process(const cl_parser& cl)
{
	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		std::string target;
		make_target_name(target, source, ".anm");
		xr_obj_motion omotion;
		if (load_xrdemo(omotion, source)) {
			if (!omotion.save_anm(target.c_str()))
				msg("can't save %s", target.c_str());
		} else {
			msg("can't load %s", source);
		}
	}
}